

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O3

void gotcha_assert_fail(char *s,char *file,uint line,char *function)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char linestr [64];
  char local_58 [64];
  
  iVar2 = ulong_to_str((ulong)line,local_58,0x3f);
  if (iVar2 == -1) {
    local_58[0] = '\0';
  }
  lVar4 = -1;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while (file[lVar1] != '\0');
  syscall(1,2,file);
  syscall(1,2,":",1);
  lVar4 = -1;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while (local_58[lVar1] != '\0');
  syscall(1,2,local_58);
  syscall(1,2,": ",2);
  lVar4 = -1;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while (function[lVar1] != '\0');
  syscall(1,2,function);
  syscall(1,2,": Assertion `",0xd);
  lVar4 = -1;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while (s[lVar1] != '\0');
  syscall(1,2,s);
  syscall(1,2,"\' failed.\n",10);
  uVar3 = syscall(0x27);
  syscall(0x3e,uVar3 & 0xffffffff,6);
  return;
}

Assistant:

void gotcha_assert_fail(const char *s, const char *file, unsigned int line, const char *function)
{
   char linestr[64];
   int result;

   result = ulong_to_str(line, linestr, sizeof(linestr)-1);
   if (result == -1)
      linestr[0] = '\0';

   gotcha_write(2, file, gotcha_strlen(file));
   gotcha_write(2, ":", 1);
   gotcha_write(2, linestr, gotcha_strlen(linestr));
   gotcha_write(2, ": ", 2);
   gotcha_write(2, function, gotcha_strlen(function));
   gotcha_write(2, ": Assertion `", 13);
   gotcha_write(2, s, gotcha_strlen(s));
   gotcha_write(2, "' failed.\n", 10);
   syscall(SYS_kill, gotcha_getpid(), SIGABRT);
}